

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tuple.h
# Opt level: O3

void __thiscall
kj::_::
Tuple<kj::Array<char>,kj::Maybe<kj::Array<char>>,kj::Maybe<kj::_::Tuple<kj::Maybe<char>,kj::Array<char>>>>
::
Tuple<kj::Array<char>,kj::Maybe<kj::Array<char>>,kj::Maybe<kj::_::Tuple<kj::Maybe<char>,kj::Array<char>>>>
          (Tuple<kj::Array<char>,kj::Maybe<kj::Array<char>>,kj::Maybe<kj::_::Tuple<kj::Maybe<char>,kj::Array<char>>>>
           *this,Array<char> *params,Maybe<kj::Array<char>_> *params_1,
          Maybe<kj::_::Tuple<kj::Maybe<char>,_kj::Array<char>_>_> *params_2)

{
  *(char **)this = params->ptr;
  *(size_t *)(this + 8) = params->size_;
  *(ArrayDisposer **)(this + 0x10) = params->disposer;
  params->ptr = (char *)0x0;
  params->size_ = 0;
  Maybe<kj::Array<char>_>::Maybe((Maybe<kj::Array<char>_> *)(this + 0x18),params_1);
  Maybe<kj::_::Tuple<kj::Maybe<char>,_kj::Array<char>_>_>::Maybe
            ((Maybe<kj::_::Tuple<kj::Maybe<char>,_kj::Array<char>_>_> *)(this + 0x38),params_2);
  return;
}

Assistant:

constexpr Tuple(Params&&... params): impl(kj::fwd<Params>(params)...) {}